

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::IdWithExprCoverageBinInitializerSyntax::setChild
          (IdWithExprCoverageBinInitializerSyntax *this,size_t index,TokenOrSyntax child)

{
  SyntaxNode *pSVar1;
  WithClauseSyntax *pWVar2;
  Token TVar3;
  
  if (index == 0) {
    TVar3 = ConstTokenOrSyntax::token(&child.super_ConstTokenOrSyntax);
    (this->id).kind = TVar3.kind;
    (this->id).field_0x2 = TVar3._2_1_;
    (this->id).numFlags = (NumericTokenFlags)TVar3.numFlags.raw;
    (this->id).rawLen = TVar3.rawLen;
    (this->id).info = TVar3.info;
  }
  else {
    pSVar1 = TokenOrSyntax::node(&child);
    if (pSVar1 == (SyntaxNode *)0x0) {
      pWVar2 = (WithClauseSyntax *)0x0;
    }
    else {
      pWVar2 = (WithClauseSyntax *)TokenOrSyntax::node(&child);
    }
    (this->withClause).ptr = pWVar2;
  }
  return;
}

Assistant:

void IdWithExprCoverageBinInitializerSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: id = child.token(); return;
        case 1: withClause = child.node() ? &child.node()->as<WithClauseSyntax>() : nullptr; return;
        default: SLANG_UNREACHABLE;
    }
}